

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O3

int floatx80_is_signaling_nan_mips64(floatx80 a,float_status *status)

{
  bool bVar1;
  
  if (status->snan_bit_is_one == '\0') {
    bVar1 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0 &&
            ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0;
  }
  else {
    bVar1 = ((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0;
  }
  return (int)(byte)((~a._8_4_ & 0x7fff) == 0 & bVar1);
}

Assistant:

int floatx80_is_signaling_nan(floatx80 a, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return 0;
#else
    if (snan_bit_is_one(status)) {
        return ((a.high & 0x7FFF) == 0x7FFF)
            && ((a.low << 1) >= 0x8000000000000000ULL);
    } else {
        uint64_t aLow;

        aLow = a.low & ~UINT64_C(0x4000000000000000);
        return ((a.high & 0x7FFF) == 0x7FFF)
            && (uint64_t)(aLow << 1)
            && (a.low == aLow);
    }
#endif
}